

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucs2fontmap.c
# Opt level: O3

int ucs2fontmap(char *s,uint ucs,int enc)

{
  ushort uVar1;
  char cVar2;
  int iVar3;
  byte *pbVar4;
  uchar *puVar5;
  char *pcVar6;
  uchar uVar7;
  Summary16 *pSVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  
  bVar10 = (byte)ucs;
  switch(enc) {
  case 0:
    *(ushort *)s = (ushort)ucs << 8 | (ushort)ucs >> 8;
    return 0;
  case 1:
    if (ucs - 1 < 0xff) {
      *s = '\0';
      s[1] = bVar10;
      return 1;
    }
    break;
  case 2:
    if (ucs < 0xa1) {
      *s = '\0';
      s[1] = bVar10;
      return 2;
    }
    if (0x17f < ucs) {
      if ((ucs & 0xffffffe0) != 0x2c0) {
        return -1;
      }
      *s = '\0';
      uVar12 = (ulong)(ucs - 0x2c0);
      s[1] = ""[uVar12];
      iVar3 = 2;
      uVar9 = 0xd4ffff7f;
LAB_001fbe02:
      if ((uVar9 >> (uVar12 & 0x3f) & 1) != 0) {
        return -1;
      }
      return iVar3;
    }
    *s = '\0';
    uVar7 = iso8859_2_page00[ucs - 0xa0];
    s[1] = uVar7;
    iVar3 = 2;
    goto LAB_001fbb15;
  case 3:
    if (ucs < 0xa0) goto LAB_001fbe5f;
    if (ucs < 0x100) {
      uVar11 = ucs - 0xa0;
      puVar5 = iso8859_3_page00;
LAB_001fb8d3:
      pbVar4 = puVar5 + uVar11;
    }
    else {
      if (0x77 < ucs - 0x108) {
        if ((ucs & 0xfffffff8) != 0x2d8) {
          return -1;
        }
        uVar11 = ucs - 0x2d8;
        puVar5 = iso8859_3_page02;
        goto LAB_001fb8d3;
      }
      pbVar4 = iso8859_3_page01 + (ucs - 0x108);
    }
    ucs = (uint)*pbVar4;
    if (*pbVar4 != 0) {
LAB_001fbe5f:
      *s = (char)ucs;
      return 3;
    }
    break;
  case 4:
    if (0x9f < ucs) {
      if (ucs < 0x180) {
        uVar11 = ucs - 0xa0;
        puVar5 = iso8859_4_page00;
      }
      else {
        if ((ucs & 0xffffffe0) != 0x2c0) {
          return -1;
        }
        uVar11 = ucs - 0x2c0;
        puVar5 = "";
      }
      ucs = (uint)puVar5[uVar11];
      if (puVar5[uVar11] == 0) {
        return -1;
      }
    }
    *s = (char)ucs;
    return 4;
  case 5:
    if (0x9f < ucs) {
      if (ucs < 0xb0) {
        pbVar4 = iso8859_5_page00 + (ucs - 0xa0);
      }
      else {
        if (0x5f < ucs - 0x400) {
          bVar10 = 0xf0;
          if (ucs != 0x2116) {
            return -1;
          }
          goto LAB_001fc229;
        }
        pbVar4 = "" + (ucs - 0x400);
      }
      bVar10 = *pbVar4;
      if (bVar10 == 0) {
        return -1;
      }
    }
LAB_001fc229:
    *s = bVar10;
    return 5;
  case 6:
    if (0x9f < ucs) {
      if (ucs < 0xb0) {
        pbVar4 = iso8859_6_page00 + (ucs - 0xa0);
      }
      else {
        if (0x4f < ucs - 0x608) {
          return -1;
        }
        pbVar4 = "" + (ucs - 0x608);
      }
      ucs = (uint)*pbVar4;
      if (*pbVar4 == 0) {
        return -1;
      }
    }
    *s = (char)ucs;
    return 6;
  case 7:
    if (ucs < 0xa0) goto LAB_001fbe8f;
    if (ucs < 0xc0) {
      uVar11 = ucs - 0xa0;
      puVar5 = iso8859_7_page00;
LAB_001fb900:
      pbVar4 = puVar5 + uVar11;
    }
    else {
      if (0x4f < ucs - 0x380) {
        if ((ucs & 0xfffffff0) != 0x2010) {
          return -1;
        }
        uVar11 = ucs - 0x2010;
        puVar5 = "";
        goto LAB_001fb900;
      }
      pbVar4 = "" + (ucs - 0x380);
    }
    ucs = (uint)*pbVar4;
    if (*pbVar4 != 0) {
LAB_001fbe8f:
      *s = (char)ucs;
      return 7;
    }
    break;
  case 8:
    if (0x9f < ucs) {
      if (ucs < 0xf8) {
        pbVar4 = iso8859_8_page00 + (ucs - 0xa0);
      }
      else {
        uVar11 = ucs - 0x5d0;
        if (uVar11 < 0x20) {
          puVar5 = iso8859_8_page05;
        }
        else {
          uVar11 = ucs - 0x2008;
          if (0xf < uVar11) {
            return -1;
          }
          puVar5 = "";
        }
        pbVar4 = puVar5 + uVar11;
      }
      ucs = (uint)*pbVar4;
      if (*pbVar4 == 0) {
        return -1;
      }
    }
    *s = (char)ucs;
    return 8;
  case 9:
    if (0xcf < ucs) {
      if (ucs < 0x100) {
        pbVar4 = "" + (ucs - 0xd0);
      }
      else {
        if (0x47 < ucs - 0x118) {
          return -1;
        }
        pbVar4 = "" + (ucs - 0x118);
      }
      ucs = (uint)*pbVar4;
      if (*pbVar4 == 0) {
        return -1;
      }
    }
    *s = (char)ucs;
    return 9;
  case 10:
    if (ucs < 0xa0) {
LAB_001fc020:
      *s = bVar10;
      return 10;
    }
    if (ucs < 0x180) {
      bVar10 = iso8859_10_page00[ucs - 0xa0];
      if (bVar10 != 0) goto LAB_001fc020;
    }
    else {
      bVar10 = 0xbd;
      if (ucs == 0x2015) goto LAB_001fc020;
    }
    break;
  case 0xb:
    if (0x9f < ucs) {
      if (ucs < 0x180) {
        uVar11 = ucs - 0xa0;
        puVar5 = iso8859_13_page00;
      }
      else {
        if ((ucs & 0xfffffff8) != 0x2018) {
          return -1;
        }
        uVar11 = ucs - 0x2018;
        puVar5 = "";
      }
      ucs = (uint)puVar5[uVar11];
      if (puVar5[uVar11] == 0) {
        return -1;
      }
    }
    *s = (char)ucs;
    return 0xb;
  case 0xc:
    if (ucs < 0xa0) goto LAB_001fbd7a;
    if (ucs < 0x100) {
      uVar9 = (ulong)(ucs - 0xa0);
      puVar5 = iso8859_14_page00;
LAB_001fb7d4:
      pbVar4 = puVar5 + uVar9;
    }
    else {
      uVar11 = ucs - 0x108;
      if (0x1f < uVar11) {
        if ((ucs & 0xfffffff0) == 0x170) {
          uVar9 = (ulong)(ucs - 0x170);
          puVar5 = "";
        }
        else {
          uVar11 = ucs - 0x1e00;
          if (uVar11 < 0x88) {
            puVar5 = "";
            goto LAB_001fbd6b;
          }
          if ((ucs & 0xfffffff8) != 0x1ef0) {
            return -1;
          }
          uVar9 = (ulong)(ucs - 0x1ef0);
          puVar5 = "";
        }
        goto LAB_001fb7d4;
      }
      puVar5 = "";
LAB_001fbd6b:
      pbVar4 = puVar5 + uVar11;
    }
    ucs = (uint)*pbVar4;
    if (*pbVar4 != 0) {
LAB_001fbd7a:
      *s = (char)ucs;
      return 0xc;
    }
    break;
  case 0xd:
    if (ucs < 0xa0) goto LAB_001fbbf7;
    if (ucs < 0xc0) {
      pbVar4 = iso8859_15_page00 + (ucs - 0xa0);
    }
    else {
      if (ucs < 0x100) goto LAB_001fbbf7;
      if (0x2f < ucs - 0x150) {
        bVar10 = 0xa4;
        if (ucs != 0x20ac) {
          return -1;
        }
        goto LAB_001fbbf7;
      }
      pbVar4 = "" + (ucs - 0x150);
    }
    bVar10 = *pbVar4;
    if (bVar10 != 0) {
LAB_001fbbf7:
      *s = bVar10;
      return 0xd;
    }
    break;
  case 0xe:
    if (ucs < 0x80) goto LAB_001fc12e;
    if (ucs - 0xa0 < 0x58) {
      uVar9 = (ulong)(ucs - 0xa0);
      puVar5 = koi8_r_page00;
LAB_001fc11f:
      pbVar4 = puVar5 + uVar9;
    }
    else {
      if (ucs - 0x400 < 0x58) {
        uVar9 = (ulong)(ucs - 0x400);
        puVar5 = "";
        goto LAB_001fc11f;
      }
      if (ucs - 0x2218 < 0x50) {
        uVar9 = (ulong)(ucs - 0x2218);
        puVar5 = "";
        goto LAB_001fc11f;
      }
      if ((ucs & 0xfffffff8) != 0x2320) {
        if (0xa7 < ucs - 0x2500) {
          return -1;
        }
        uVar9 = (ulong)(ucs - 0x2500);
        puVar5 = koi8_r_page25;
        goto LAB_001fc11f;
      }
      pbVar4 = koi8_r_page23 + (ucs - 0x2320);
    }
    ucs = (uint)*pbVar4;
    if (*pbVar4 != 0) {
LAB_001fc12e:
      *s = (char)ucs;
      return 0xe;
    }
    break;
  case 0xf:
    if (ucs < 0x100) {
      uVar9 = (ulong)(ucs >> 4);
      pSVar8 = big5_uni2indx_page00;
LAB_001fc536:
      pSVar8 = pSVar8 + uVar9;
    }
    else {
      if (ucs - 0x200 < 0x260) {
        uVar9 = (ulong)((ucs >> 4) - 0x20);
        pSVar8 = big5_uni2indx_page02;
        goto LAB_001fc536;
      }
      if (ucs - 0x2000 < 0x2c0) {
        uVar9 = (ulong)((ucs >> 4) - 0x200);
        pSVar8 = big5_uni2indx_page20;
        goto LAB_001fc536;
      }
      if (ucs - 0x2400 < 0x250) {
        uVar9 = (ulong)((ucs >> 4) - 0x240);
        pSVar8 = big5_uni2indx_page24;
        goto LAB_001fc536;
      }
      if (ucs - 0x3000 < 0x3e0) {
        uVar9 = (ulong)((ucs >> 4) - 0x300);
        pSVar8 = big5_uni2indx_page30;
        goto LAB_001fc536;
      }
      if (ucs - 0x4e00 < 0x51b0) {
        uVar9 = (ulong)((ucs >> 4) - 0x4e0);
        pSVar8 = big5_uni2indx_page4e;
        goto LAB_001fc536;
      }
      if ((ucs & 0xfffffff0) != 64000) {
        if (0x16f < ucs - 0xfe00) {
          return -1;
        }
        uVar9 = (ulong)((ucs >> 4) - 0xfe0);
        pSVar8 = big5_uni2indx_pagefe;
        goto LAB_001fc536;
      }
      pSVar8 = big5_uni2indx_pagefa;
    }
    if ((pSVar8->used >> (ucs & 0xf) & 1) != 0) {
      uVar11 = (uint)pSVar8->used & (1 << (bVar10 & 0xf)) - 1U;
      uVar11 = (uVar11 >> 1 & 0x1555) + (uVar11 & 0x5555);
      uVar11 = (uVar11 >> 2 & 0x1333) + (uVar11 & 0x3333);
      uVar11 = (uVar11 >> 4 & 0x707) + (uVar11 & 0x707);
      *(unsigned_short *)s =
           big5_2charset[((uVar11 >> 8) + uVar11 & 0xff) + (uint)pSVar8->indx] << 8 |
           big5_2charset[((uVar11 >> 8) + uVar11 & 0xff) + (uint)pSVar8->indx] >> 8;
      return 0xf;
    }
    break;
  case 0x10:
    if (ucs < 0x460) {
      uVar9 = (ulong)(ucs >> 4);
      pSVar8 = ksc5601_uni2indx_page00;
    }
    else if (ucs - 0x2000 < 0x670) {
      uVar9 = (ulong)((ucs >> 4) - 0x200);
      pSVar8 = ksc5601_uni2indx_page20;
    }
    else if (ucs - 0x3000 < 0x3e0) {
      uVar9 = (ulong)((ucs >> 4) - 0x300);
      pSVar8 = ksc5601_uni2indx_page30;
    }
    else if (ucs - 0x4e00 < 0x51a0) {
      uVar9 = (ulong)((ucs >> 4) - 0x4e0);
      pSVar8 = ksc5601_uni2indx_page4e;
    }
    else if (ucs - 0xac00 < 0x2ba0) {
      uVar9 = (ulong)((ucs >> 4) - 0xac0);
      pSVar8 = ksc5601_uni2indx_pageac;
    }
    else if (ucs - 0xf900 < 0x110) {
      uVar9 = (ulong)((ucs >> 4) - 0xf90);
      pSVar8 = ksc5601_uni2indx_pagef9;
    }
    else {
      if (0xef < ucs - 0xff00) {
        return -1;
      }
      uVar9 = (ulong)((ucs >> 4) - 0xff0);
      pSVar8 = ksc5601_uni2indx_pageff;
    }
    uVar1 = pSVar8[uVar9].used;
    if ((uVar1 >> (ucs & 0xf) & 1) != 0) {
      uVar11 = (uint)uVar1 & (1 << (bVar10 & 0xf)) - 1U;
      uVar11 = (uVar11 >> 1 & 0x1555) + (uVar11 & 0x5555);
      uVar11 = (uVar11 >> 2 & 0x1333) + (uVar11 & 0x3333);
      uVar11 = (uVar11 >> 4 & 0x707) + (uVar11 & 0x707);
      *(unsigned_short *)s =
           ksc5601_2charset[((uVar11 >> 8) + uVar11 & 0xff) + (uint)pSVar8[uVar9].indx] << 8 |
           ksc5601_2charset[((uVar11 >> 8) + uVar11 & 0xff) + (uint)pSVar8[uVar9].indx] >> 8;
      return 0x10;
    }
    break;
  case 0x11:
    if (ucs < 0x460) {
      uVar9 = (ulong)(ucs >> 4);
      pSVar8 = gb2312_uni2indx_page00;
    }
    else if (ucs - 0x2000 < 0x650) {
      uVar9 = (ulong)((ucs >> 4) - 0x200);
      pSVar8 = gb2312_uni2indx_page20;
    }
    else if (ucs - 0x3000 < 0x230) {
      uVar9 = (ulong)((ucs >> 4) - 0x300);
      pSVar8 = gb2312_uni2indx_page30;
    }
    else if (ucs - 0x4e00 < 0x4ef0) {
      uVar9 = (ulong)((ucs >> 4) - 0x4e0);
      pSVar8 = gb2312_uni2indx_page4e;
    }
    else if (ucs - 0x9e00 < 0x1b0) {
      uVar9 = (ulong)((ucs >> 4) - 0x9e0);
      pSVar8 = gb2312_uni2indx_page9e;
    }
    else {
      if (0xef < ucs - 0xff00) {
        return -1;
      }
      uVar9 = (ulong)((ucs >> 4) - 0xff0);
      pSVar8 = gb2312_uni2indx_pageff;
    }
    uVar1 = pSVar8[uVar9].used;
    if ((uVar1 >> (ucs & 0xf) & 1) != 0) {
      uVar11 = (uint)uVar1 & (1 << (bVar10 & 0xf)) - 1U;
      uVar11 = (uVar11 >> 1 & 0x1555) + (uVar11 & 0x5555);
      uVar11 = (uVar11 >> 2 & 0x1333) + (uVar11 & 0x3333);
      uVar11 = (uVar11 >> 4 & 0x707) + (uVar11 & 0x707);
      *(unsigned_short *)s =
           gb2312_2charset[((uVar11 >> 8) + uVar11 & 0xff) + (uint)pSVar8[uVar9].indx] << 8 |
           gb2312_2charset[((uVar11 >> 8) + uVar11 & 0xff) + (uint)pSVar8[uVar9].indx] >> 8;
      return 0x11;
    }
    break;
  case 0x12:
    if (ucs < 0x80) {
      if (ucs == 0x5c) {
        return -1;
      }
      if (ucs == 0x7e) {
        return -1;
      }
    }
    else if (ucs == 0xa5) {
      ucs = 0x5c;
    }
    else if (ucs == 0x203e) {
      ucs = 0x7e;
    }
    else {
      if (0x3e < ucs - 0xff61) {
        return -1;
      }
      ucs = (uint)(byte)(bVar10 + 0x40);
    }
    *s = (char)ucs;
    return 0x12;
  case 0x13:
    if (ucs < 0x100) {
      uVar9 = (ulong)(ucs >> 4);
      pSVar8 = jisx0208_uni2indx_page00;
    }
    else if (ucs - 0x300 < 0x160) {
      uVar9 = (ulong)((ucs >> 4) - 0x30);
      pSVar8 = jisx0208_uni2indx_page03;
    }
    else if (ucs - 0x2000 < 800) {
      uVar9 = (ulong)((ucs >> 4) - 0x200);
      pSVar8 = jisx0208_uni2indx_page20;
    }
    else if (ucs - 0x2500 < 0x170) {
      uVar9 = (ulong)((ucs >> 4) - 0x250);
      pSVar8 = jisx0208_uni2indx_page25;
    }
    else if ((ucs & 0xffffff00) == 0x3000) {
      uVar9 = (ulong)((ucs >> 4) - 0x300);
      pSVar8 = jisx0208_uni2indx_page30;
    }
    else if (ucs - 0x4e00 < 0x51b0) {
      uVar9 = (ulong)((ucs >> 4) - 0x4e0);
      pSVar8 = jisx0208_uni2indx_page4e;
    }
    else {
      if (0xef < ucs - 0xff00) {
        return -1;
      }
      uVar9 = (ulong)((ucs >> 4) - 0xff0);
      pSVar8 = jisx0208_uni2indx_pageff;
    }
    uVar1 = pSVar8[uVar9].used;
    if ((uVar1 >> (ucs & 0xf) & 1) != 0) {
      uVar11 = (uint)uVar1 & (1 << (bVar10 & 0xf)) - 1U;
      uVar11 = (uVar11 >> 1 & 0x1555) + (uVar11 & 0x5555);
      uVar11 = (uVar11 >> 2 & 0x1333) + (uVar11 & 0x3333);
      uVar11 = (uVar11 >> 4 & 0x707) + (uVar11 & 0x707);
      *(unsigned_short *)s =
           jisx0208_2charset[((uVar11 >> 8) + uVar11 & 0xff) + (uint)pSVar8[uVar9].indx] << 8 |
           jisx0208_2charset[((uVar11 >> 8) + uVar11 & 0xff) + (uint)pSVar8[uVar9].indx] >> 8;
      return 0x13;
    }
    break;
  case 0x14:
    if (ucs < 0x460) {
      uVar9 = (ulong)(ucs >> 4);
      pSVar8 = jisx0212_uni2indx_page00;
    }
    else if (ucs - 0x2100 < 0x30) {
      uVar9 = (ulong)((ucs >> 4) - 0x210);
      pSVar8 = jisx0212_uni2indx_page21;
    }
    else {
      if (0x51af < ucs - 0x4e00) {
        return -1;
      }
      uVar9 = (ulong)((ucs >> 4) - 0x4e0);
      pSVar8 = jisx0212_uni2indx_page4e;
    }
    uVar1 = pSVar8[uVar9].used;
    if ((uVar1 >> (ucs & 0xf) & 1) != 0) {
      uVar11 = (uint)uVar1 & (1 << (bVar10 & 0xf)) - 1U;
      uVar11 = (uVar11 >> 1 & 0x1555) + (uVar11 & 0x5555);
      uVar11 = (uVar11 >> 2 & 0x1333) + (uVar11 & 0x3333);
      uVar11 = (uVar11 >> 4 & 0x707) + (uVar11 & 0x707);
      *(unsigned_short *)s =
           jisx0212_2charset[((uVar11 >> 8) + uVar11 & 0xff) + (uint)pSVar8[uVar9].indx] << 8 |
           jisx0212_2charset[((uVar11 >> 8) + uVar11 & 0xff) + (uint)pSVar8[uVar9].indx] >> 8;
      return 0x14;
    }
    break;
  case 0x15:
    if (ucs < 0xf8) {
      if (ucs < 0x20) {
        return -1;
      }
      *s = '\0';
      uVar9 = (ulong)(ucs - 0x20);
      pcVar6 = " !";
    }
    else {
      if (ucs < 0x193) {
        if (ucs != 0x192) {
          return -1;
        }
        s[0] = '\0';
        s[1] = -0x5a;
        return 0x15;
      }
      if (ucs < 0x3d7) {
        if (ucs < 0x391) {
          return -1;
        }
        *s = '\0';
        uVar9 = (ulong)(ucs - 0x391);
        pcVar6 = "ABGDEZHQIKLMNXOPR";
      }
      else {
        if (0x232a < ucs) {
          if (ucs < 0x25cb) {
            if (ucs != 0x25ca) {
              return -1;
            }
            s[0] = '\0';
            s[1] = -0x20;
            return 0x15;
          }
          if (0x2666 < ucs) {
            if (ucs < 0xf6dc) {
              if (ucs < 0xf6d9) {
                return -1;
              }
              *s = '\0';
              cVar2 = unicode_to_symbol_1b_F6D9[ucs - 0xf6d9];
            }
            else {
              if (0x19 < ucs - 0xf8e5) {
                return -1;
              }
              *s = '\0';
              cVar2 = unicode_to_symbol_1b_F8E5[ucs - 0xf8e5];
            }
            s[1] = cVar2;
            return 0x15;
          }
          if (ucs < 0x2660) {
            return -1;
          }
          *s = '\0';
          uVar12 = (ulong)(ucs - 0x2660);
          s[1] = unicode_to_symbol_1b_2660[uVar12];
          iVar3 = 0x15;
          uVar9 = 0x16;
          goto LAB_001fbe02;
        }
        if (ucs < 0x2022) {
          return -1;
        }
        *s = '\0';
        uVar9 = (ulong)(ucs - 0x2022);
        pcVar6 = unicode_to_symbol_1b_2022;
      }
    }
    uVar7 = pcVar6[uVar9];
    s[1] = uVar7;
    iVar3 = 0x15;
    goto LAB_001fbb15;
  case 0x16:
    if (ucs < 0xa1) {
      if (ucs < 0x20) {
        return -1;
      }
      *s = '\0';
      s[1] = " "[ucs - 0x20];
      if ((ucs - 0x20 & 0xffffff7f) != 0) {
        return -1;
      }
      return 0x16;
    }
    if (ucs < 0x2196) {
      if (ucs < 0x2192) {
        return -1;
      }
      *s = '\0';
      s[1] = unicode_to_dingbats_1b_2192[ucs - 0x2192];
      if (ucs - 0x2192 == 1) {
        return -1;
      }
      return 0x16;
    }
    if (ucs < 0x246a) {
      if (ucs < 0x2460) {
        return -1;
      }
      *s = '\0';
      cVar2 = unicode_to_dingbats_1b_2460[ucs - 0x2460];
LAB_001fc070:
      s[1] = cVar2;
      return 0x16;
    }
    if (ucs < 0x2667) {
      if (ucs < 0x25a0) {
        return -1;
      }
      *s = '\0';
      uVar11 = ucs - 0x25a0;
      pcVar6 = "n";
    }
    else {
      if (0x27be < ucs) {
        if (0xd < ucs - 0xf8d7) {
          return -1;
        }
        *s = '\0';
        cVar2 = unicode_to_dingbats_1b_F8D7[ucs - 0xf8d7];
        goto LAB_001fc070;
      }
      if (ucs < 0x2701) {
        return -1;
      }
      *s = '\0';
      uVar11 = ucs - 0x2701;
      pcVar6 = "!\"#$";
    }
    uVar7 = pcVar6[uVar11];
    s[1] = uVar7;
    iVar3 = 0x16;
LAB_001fbb15:
    if (uVar7 != '\0') {
      return iVar3;
    }
    break;
  case 0x17:
    if (ucs < 0x80) goto LAB_001fc309;
    if (ucs - 0xa0 < 0x58) {
      uVar9 = (ulong)(ucs - 0xa0);
      puVar5 = koi8_r_page00;
LAB_001fc2fa:
      pbVar4 = puVar5 + uVar9;
    }
    else {
      if (ucs - 0x400 < 0x98) {
        uVar9 = (ulong)(ucs - 0x400);
        puVar5 = "";
        goto LAB_001fc2fa;
      }
      if (ucs - 0x2218 < 0x50) {
        uVar9 = (ulong)(ucs - 0x2218);
        puVar5 = "";
        goto LAB_001fc2fa;
      }
      if ((ucs & 0xfffffff8) != 0x2320) {
        if (0xa7 < ucs - 0x2500) {
          return -1;
        }
        uVar9 = (ulong)(ucs - 0x2500);
        puVar5 = koi8_u_page25;
        goto LAB_001fc2fa;
      }
      pbVar4 = koi8_r_page23 + (ucs - 0x2320);
    }
    ucs = (uint)*pbVar4;
    if (*pbVar4 != 0) {
LAB_001fc309:
      *s = (char)ucs;
      return 0x17;
    }
    break;
  case 0x18:
    if (0x7f < ucs) {
      if ((ucs & 0xffffffe0) == 0xa0) {
        pbVar4 = cp1251_page00 + (ucs - 0xa0);
      }
      else {
        uVar11 = ucs - 0x400;
        if (uVar11 < 0x98) {
          puVar5 = "";
        }
        else {
          uVar11 = ucs - 0x2010;
          if (0x2f < uVar11) {
            if (ucs == 0x20ac) {
              ucs = 0x88;
            }
            else if (ucs == 0x2122) {
              ucs = 0x99;
            }
            else {
              if (ucs != 0x2116) {
                return -1;
              }
              ucs = 0xb9;
            }
            goto LAB_001fc180;
          }
          puVar5 = "";
        }
        pbVar4 = puVar5 + uVar11;
      }
      ucs = (uint)*pbVar4;
      if (*pbVar4 == 0) {
        return -1;
      }
    }
LAB_001fc180:
    *s = (char)ucs;
    return 0x18;
  case 0x19:
    if ((ucs < 0x80 || ucs == 0xa0) ||
       ((uVar11 = ucs - 0xe00, uVar11 < 0x60 && (ucs = (uint)""[uVar11], ""[uVar11] != 0)))) {
      *s = (char)ucs;
      return 0x19;
    }
  }
  return -1;
}

Assistant:

static int ucs2fontmap(char *s, unsigned int ucs, int enc) {
  switch(enc) {
  case 0:	/* iso10646-1 */
    s[0] = (char) ((ucs & 0xFF00) >> 8);
    s[1] = (char) (ucs & 0xFF);
    return 0;
  case 1:	/* iso8859-1 */
    if (ucs <= 0x00FF) {
      if (ucs >= 0x0001) {
        s[0] = 0;
        s[1] = (char) (ucs & 0xFF);
        return 1;
      }
    }
    break;
  case 2:	/* iso8859-2 */
    if (ucs <= 0x00a0) {
      s[0] = 0;
      s[1] = (char) ucs;
      return 2;
    } else if (ucs < 0x0180) {
      if (ucs >= 0x00a0) {
	s[0] = 0;
	s[1] = (char)  iso8859_2_page00[ucs-0x00a0];
        if (s[1]) return 2;
      }
    } else if (ucs < 0x02e0) {
      if (ucs >= 0x02c0) {
        s[0] = 0;
        s[1] = (char) iso8859_2_page02[ucs-0x02c0];
        if (s[1]) return 2;
      }	
    }
    break;
  case 3:	/* iso8859-3 */
    if (iso8859_3_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 3;
    } 
    break;
  case 4:	/* iso8859-4 */
    if (iso8859_4_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 4;
    } 
    break;
  case 5:	/* iso8859-5 */
    if (iso8859_5_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 5;
    } 
    break;
  case 6:	/* iso8859-6 */
    if (iso8859_6_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 6;
    } 
    break;
  case 7:	/* iso8859-7 */
    if (iso8859_7_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 7;
    } 
    break;
  case 8:	/* iso8859-8 */
    if (iso8859_8_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 8;
    } 
    break;
  case 9:	/* iso8859-9 */
    if (iso8859_9_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 9;
    } 
    break;
  case 10:	/* iso8859-10 */
    if (iso8859_10_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 10;
    } 
    break;
  case 25:	/* iso8859-11 */
    if (iso8859_11_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 25;
    } 
    break;
  case 11:	/* iso8859-13 */
    if (iso8859_13_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 11;
    } 
    break;
  case 12:	/* iso8859-14 */
    if (iso8859_14_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 12;
    } 
    break;
  case 13:	/* iso8859-15 */
    if (iso8859_15_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 13;
    } 
    break;
  case 14:	/* koi8-r */
    if (koi8_r_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 14;
    } 
    break;
  case 15:	/* big5 */
    if (big5_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 15;
    } 
    break;
  case 16:	/* ksc5601.1987-0 */
    if (ksc5601_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 16;
    } 
    break;
  case 17:	/* gb2312.1980-0 */
    if (gb2312_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 17;
    } 
    break;
  case 18:	/* jisx0201.1976-0 */
    if (jisx0201_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 18;
    } 
    break;
  case 19:	/* jisx0208.1983-0 */
    if (jisx0208_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 19;
    } 
    break;
  case 20:	/* jisx0212.1990-0 */
    if (jisx0212_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 20;
    } 
    break;
  case 21:	/* symbol */
    if (ucs <= 0x00F7) {
      if (ucs >= 0x0020) {
        s[0] = 0;
        s[1] = unicode_to_symbol_1b_0020[ucs - 0x0020];
        if (s[1]) return 21;
      }
    } else if (ucs <= 0x0192) {
      if (ucs >= 0x0192) {
        s[0] = 0;
        s[1] = unicode_to_symbol_1b_0192[ucs - 0x0192];
        if (s[1]) return 21;
      }
    } else if (ucs <= 0x03D6) {
      if (ucs >= 0x0391) {
        s[0] = 0;
        s[1] = unicode_to_symbol_1b_0391[ucs - 0x0391];
        if (s[1]) return 21;
      }
    } else if (ucs <= 0x232A) {
      if (ucs >= 0x2022) {
        s[0] = 0;
        s[1] = unicode_to_symbol_1b_2022[ucs - 0x2022];
        if (s[1]) return 21;
      }
    } else if (ucs <= 0x25CA) {
      if (ucs >= 0x25CA) {
        s[0] = 0;
        s[1] = unicode_to_symbol_1b_25CA[ucs - 0x25CA];
        if (s[1]) return 21;
      }
    } else if (ucs <= 0x2666) {
      if (ucs >= 0x2660) {
        s[0] = 0;
        s[1] = unicode_to_symbol_1b_2660[ucs - 0x2660];
        if (s[1]) return 21;
      }
    } else if (ucs <= 0xF6DB) {
      if (ucs >= 0xF6D9) {
        s[0] = 0;
        s[1] = unicode_to_symbol_1b_F6D9[ucs - 0xF6D9];
        if (s[1]) return 21;
      }
    } else if (ucs <= 0xF8FE) {
      if (ucs >= 0xF8E5) {
        s[0] = 0;
        s[1] = unicode_to_symbol_1b_F8E5[ucs - 0xF8E5];
        if (s[1]) return 21;
      }
    }
    break;
  case 22:	/* dingbats */
    if (ucs <= 0x00A0) {
      if (ucs >= 0x0020) {
        s[0] = 0;
        s[1] = unicode_to_dingbats_1b_0020[ucs - 0x0020];
        if (s[1]) return 22;
      }
    } else if (ucs <= 0x2195) {
      if (ucs >= 0x2192) {
        s[0] = 0;
        s[1] = unicode_to_dingbats_1b_2192[ucs - 0x2192];
        if (s[1]) return 22;
      }
    } else if (ucs <= 0x2469) {
      if (ucs >= 0x2460) {
        s[0] = 0;
        s[1] = unicode_to_dingbats_1b_2460[ucs - 0x2460];
        if (s[1]) return 22;
      }
    } else if (ucs <= 0x2666) {
      if (ucs >= 0x25A0) {
        s[0] = 0;
        s[1] = unicode_to_dingbats_1b_25A0[ucs - 0x25A0];
        if (s[1]) return 22;
      }
    } else if (ucs <= 0x27BE) {
      if (ucs >= 0x2701) {
        s[0] = 0;
        s[1] = unicode_to_dingbats_1b_2701[ucs - 0x2701];
        if (s[1]) return 22;
      }
    } else if (ucs <= 0xF8E4) {
      if (ucs >= 0xF8D7) {
        s[0] = 0;
        s[1] = unicode_to_dingbats_1b_F8D7[ucs - 0xF8D7];
        if (s[1]) return 22;
      }
    }
    break;
  case 23:	/* koi8-u */
    if (koi8_u_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 23;
    } 
    break;
  case 24:	/* microsoft-cp1251 */
    if (cp1251_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 24;
    } 
    break;
  case 26: /* gbk/cp936ext */
    if (cp936ext_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 26;
    }
    break;
  default:
    break;
  };
  return -1;
}